

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::TextGenerator::Write
          (TextGenerator *this,char *data,size_t size)

{
  int iVar1;
  char *data_00;
  size_t size_00;
  char *local_28;
  void *void_buffer;
  size_t size_local;
  char *data_local;
  TextGenerator *this_local;
  
  if (((this->failed_ & 1U) == 0) && (size != 0)) {
    void_buffer = (void *)size;
    size_local = (size_t)data;
    data_local = (char *)this;
    if ((this->at_start_of_line_ & 1U) != 0) {
      this->at_start_of_line_ = false;
      data_00 = (char *)std::__cxx11::string::data();
      size_00 = std::__cxx11::string::size();
      Write(this,data_00,size_00);
      if ((this->failed_ & 1U) != 0) {
        return;
      }
    }
    while ((void *)(long)this->buffer_size_ < void_buffer) {
      memcpy(this->buffer_,(void *)size_local,(long)this->buffer_size_);
      size_local = size_local + (long)this->buffer_size_;
      void_buffer = (void *)((long)void_buffer - (long)this->buffer_size_);
      iVar1 = (*this->output_->_vptr_ZeroCopyOutputStream[2])
                        (this->output_,&local_28,&this->buffer_size_);
      this->failed_ = (bool)(((byte)iVar1 ^ 0xff) & 1);
      if ((this->failed_ & 1U) != 0) {
        return;
      }
      this->buffer_ = local_28;
    }
    memcpy(this->buffer_,(void *)size_local,(size_t)void_buffer);
    this->buffer_ = (char *)((long)void_buffer + (long)this->buffer_);
    this->buffer_size_ = this->buffer_size_ - (int)void_buffer;
  }
  return;
}

Assistant:

void Write(const char* data, size_t size) {
    if (failed_) return;
    if (size == 0) return;

    if (at_start_of_line_) {
      // Insert an indent.
      at_start_of_line_ = false;
      Write(indent_.data(), indent_.size());
      if (failed_) return;
    }

    while (size > buffer_size_) {
      // Data exceeds space in the buffer.  Copy what we can and request a
      // new buffer.
      memcpy(buffer_, data, buffer_size_);
      data += buffer_size_;
      size -= buffer_size_;
      void* void_buffer;
      failed_ = !output_->Next(&void_buffer, &buffer_size_);
      if (failed_) return;
      buffer_ = reinterpret_cast<char*>(void_buffer);
    }

    // Buffer is big enough to receive the data; copy it.
    memcpy(buffer_, data, size);
    buffer_ += size;
    buffer_size_ -= size;
  }